

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adksys_procfs.c
# Opt level: O2

int adksys_get_cmdline_buffer(char **output_buffer,int *output_size)

{
  int iVar1;
  FILE *__stream;
  char *__ptr;
  size_t sVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  
  __stream = fopen("/proc/self/cmdline","r");
  if (__stream == (FILE *)0x0) {
    __ptr = (char *)0x0;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    while (iVar1 = feof(__stream), iVar1 == 0) {
      fgetc(__stream);
      uVar5 = uVar5 + 1;
    }
    __ptr = (char *)calloc(1,uVar5 + 1);
    if (__ptr != (char *)0x0) {
      uVar4 = 0;
      fseek(__stream,0,0);
      do {
        sVar2 = fread(__ptr + uVar4,1,uVar5 - uVar4,__stream);
        if (sVar2 == 0) {
          piVar3 = __errno_location();
          if (*piVar3 != 4) {
            iVar1 = feof(__stream);
            if (iVar1 == 0) goto LAB_00103a57;
            break;
          }
        }
        else {
          uVar4 = uVar4 + sVar2;
        }
      } while (uVar4 < uVar5);
      fclose(__stream);
      *output_buffer = __ptr;
      *output_size = (int)uVar5;
      return 0;
    }
LAB_00103a57:
    fclose(__stream);
  }
  free(__ptr);
  return -1;
}

Assistant:

int adksys_get_cmdline_buffer(char **output_buffer, int *output_size)
{
   FILE *f = NULL;
   size_t bytes_read = 0, size = 0;
   char *buffer = NULL;
   size_t result;
   
   f = fopen("/proc/self/cmdline", "r");
   if (!f)
      goto error;
   while (!feof(f)) {
      fgetc(f);
      size += 1;
   }
   size--;
   buffer = (char *) malloc(size+1);
   if (!buffer)
      goto error;
   memset(buffer, 0, size+1);
   
   result = fseek(f, SEEK_SET, 0);
   do {
      result = fread(buffer + bytes_read, 1, size - bytes_read, f);
      if (result == 0 && errno == EINTR)
         continue;
      else if (result == 0 && feof(f))
         break;
      else if (result == 0)
         goto error;
      bytes_read += result;
   } while (bytes_read < size);

   fclose(f);
   *output_buffer = buffer;
   *output_size = size;
   return 0;
   
  error:
   if (f)
      fclose(f);
   if (buffer)
      free(buffer);
   return -1;
}